

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
TasGrid::MultiIndexManipulations::referencePoints<true>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *levels,
          OneDimensionalWrapper *wrapper,MultiIndexSet *points)

{
  allocator<int> *this;
  int iVar1;
  bool bVar2;
  int iVar3;
  pointer piVar4;
  reference pvVar5;
  reference piVar6;
  reference piVar7;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_c8;
  int local_bc;
  undefined1 local_b8 [4];
  int j_1;
  reverse_iterator n_1;
  int local_a8;
  int t;
  int i;
  vector<int,_std::allocator<int>_> p;
  iterator iStack_80;
  int n;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_t j;
  int num_total;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> num_points;
  size_t num_dimensions;
  MultiIndexSet *points_local;
  OneDimensionalWrapper *wrapper_local;
  int *levels_local;
  vector<int,_std::allocator<int>_> *refs;
  
  piVar4 = (pointer)MultiIndexSet::getNumDimensions(points);
  num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar4;
  ::std::allocator<int>::allocator(&local_49);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,(size_type)piVar4,&local_49);
  ::std::allocator<int>::~allocator(&local_49);
  j._0_4_ = 1;
  for (__range2 = (vector<int,_std::allocator<int>_> *)0x0;
      __range2 <
      num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage;
      __range2 = (vector<int,_std::allocator<int>_> *)
                 ((long)&(__range2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    iVar3 = OneDimensionalWrapper::getNumPoints(wrapper,levels[(long)__range2]);
    pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(size_type)__range2);
    *pvVar5 = iVar3;
  }
  __end2 = ::std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_48);
  iStack_80 = ::std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_48);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff80);
    if (!bVar2) break;
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end2);
    p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = *piVar6;
    j._0_4_ = p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ * (int)j;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _3_1_ = 0;
  this = (allocator<int> *)
         ((long)&p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 2);
  ::std::allocator<int>::allocator(this);
  ::std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(long)(int)j,this);
  ::std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_end_of_storage + 2));
  piVar4 = num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  ::std::allocator<int>::allocator((allocator<int> *)((long)&t + 3));
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&i,(size_type)piVar4,
             (allocator<int> *)((long)&t + 3));
  ::std::allocator<int>::~allocator((allocator<int> *)((long)&t + 3));
  for (local_a8 = 0; local_a8 < (int)j; local_a8 = local_a8 + 1) {
    n_1.current._M_current._4_4_ = local_a8;
    ::std::vector<int,_std::allocator<int>_>::rbegin((vector<int,_std::allocator<int>_> *)local_b8);
    local_bc = (int)num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
    while (iVar3 = n_1.current._M_current._4_4_, local_bc = local_bc + -1, -1 < local_bc) {
      piVar7 = ::std::
               reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                            *)local_b8);
      iVar1 = *piVar7;
      pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i,(long)local_bc);
      *pvVar5 = iVar3 % iVar1;
      ::std::
      reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&local_c8,
                   (int)(reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                         *)local_b8);
      piVar7 = ::std::
               reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*(&local_c8);
      n_1.current._M_current._4_4_ = n_1.current._M_current._4_4_ / *piVar7;
    }
    iVar3 = MultiIndexSet::getSlot(points,(vector<int,_std::allocator<int>_> *)&i);
    pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_a8);
    *pvVar5 = iVar3;
  }
  p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _3_1_ = 1;
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  if ((p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._3_1_ & 1) == 0) {
    ::std::vector<int,_std::allocator<int>_>::~vector(__return_storage_ptr__);
  }
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> referencePoints(const int levels[], const OneDimensionalWrapper &wrapper, const MultiIndexSet &points){
    size_t num_dimensions = (size_t) points.getNumDimensions();
    std::vector<int> num_points(num_dimensions);
    int num_total = 1; // this will be a subset of all points, no danger of overflow
    for(size_t j=0; j<num_dimensions; j++) num_points[j] = wrapper.getNumPoints(levels[j]);
    for(auto n : num_points) num_total *= n;

    std::vector<int> refs(num_total);
    std::vector<int> p(num_dimensions);

    for(int i=0; i<num_total; i++){
        int t = i;
        auto n = num_points.rbegin();
        for(int j=(int) num_dimensions-1; j>=0; j--){
            p[j] = (nested) ? t % *n : wrapper.getPointIndex(levels[j], t % *n);
            t /= *n++;
        }
        refs[i] = points.getSlot(p);
    }
    return refs;
}